

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat3x4.c
# Opt level: O0

void glmc_mat3x4_mulv(vec4 *m,float *v,float *dest)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float *dest_local;
  float *v_local;
  vec4 *m_local;
  float v2;
  float v1;
  float v0;
  
  fVar1 = *v;
  fVar2 = v[1];
  fVar3 = v[2];
  *dest = m[2][0] * fVar3 + (*m)[0] * fVar1 + m[1][0] * fVar2;
  dest[1] = m[2][1] * fVar3 + (*m)[1] * fVar1 + m[1][1] * fVar2;
  dest[2] = m[2][2] * fVar3 + (*m)[2] * fVar1 + m[1][2] * fVar2;
  dest[3] = m[2][3] * fVar3 + (*m)[3] * fVar1 + m[1][3] * fVar2;
  return;
}

Assistant:

CGLM_EXPORT
void
glmc_mat3x4_mulv(mat3x4 m, vec3 v, vec4 dest) {
  glm_mat3x4_mulv(m, v, dest);
}